

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Maybe<kj::Array<capnp::PipelineOp>_> * capnp::_::anon_unknown_0::toPipelineOps(Reader ops)

{
  bool bVar1;
  Which WVar2;
  uint uVar3;
  Maybe<kj::Array<capnp::PipelineOp>_> *in_RDI;
  Iterator IVar4;
  Array<capnp::PipelineOp> local_e8;
  undefined4 local_d0;
  uint local_cc;
  Fault local_c8;
  Fault f;
  PipelineOp op;
  Reader opReader;
  undefined1 local_78 [8];
  Iterator __end2;
  undefined1 local_48 [8];
  Iterator __begin2;
  Reader *__range2;
  ArrayBuilder<capnp::PipelineOp> result;
  
  uVar3 = List<capnp::rpc::PromisedAnswer::Op,_(capnp::Kind)3>::Reader::size
                    ((Reader *)&stack0x00000008);
  kj::heapArrayBuilder<capnp::PipelineOp>((ArrayBuilder<capnp::PipelineOp> *)&__range2,(ulong)uVar3)
  ;
  __begin2._8_8_ = (Reader *)&stack0x00000008;
  IVar4 = List<capnp::rpc::PromisedAnswer::Op,_(capnp::Kind)3>::Reader::begin
                    ((Reader *)&stack0x00000008);
  __end2._8_8_ = IVar4.container;
  __begin2.container._0_4_ = IVar4.index;
  local_48 = (undefined1  [8])__end2._8_8_;
  IVar4 = List<capnp::rpc::PromisedAnswer::Op,_(capnp::Kind)3>::Reader::end
                    ((Reader *)__begin2._8_8_);
  local_78 = (undefined1  [8])IVar4.container;
  __end2.container._0_4_ = IVar4.index;
  do {
    bVar1 = IndexingIterator<const_capnp::List<capnp::rpc::PromisedAnswer::Op,_(capnp::Kind)3>::Reader,_capnp::rpc::PromisedAnswer::Op::Reader>
            ::operator!=((IndexingIterator<const_capnp::List<capnp::rpc::PromisedAnswer::Op,_(capnp::Kind)3>::Reader,_capnp::rpc::PromisedAnswer::Op::Reader>
                          *)local_48,
                         (IndexingIterator<const_capnp::List<capnp::rpc::PromisedAnswer::Op,_(capnp::Kind)3>::Reader,_capnp::rpc::PromisedAnswer::Op::Reader>
                          *)local_78);
    if (!bVar1) {
      kj::ArrayBuilder<capnp::PipelineOp>::finish
                (&local_e8,(ArrayBuilder<capnp::PipelineOp> *)&__range2);
      kj::Maybe<kj::Array<capnp::PipelineOp>_>::Maybe(in_RDI,&local_e8);
      kj::Array<capnp::PipelineOp>::~Array(&local_e8);
      local_d0 = 1;
LAB_00797470:
      kj::ArrayBuilder<capnp::PipelineOp>::~ArrayBuilder
                ((ArrayBuilder<capnp::PipelineOp> *)&__range2);
      return in_RDI;
    }
    IndexingIterator<const_capnp::List<capnp::rpc::PromisedAnswer::Op,_(capnp::Kind)3>::Reader,_capnp::rpc::PromisedAnswer::Op::Reader>
    ::operator*((Reader *)&op,
                (IndexingIterator<const_capnp::List<capnp::rpc::PromisedAnswer::Op,_(capnp::Kind)3>::Reader,_capnp::rpc::PromisedAnswer::Op::Reader>
                 *)local_48);
    WVar2 = rpc::PromisedAnswer::Op::Reader::which((Reader *)&op);
    if (WVar2 == NOOP) {
      f.exception._0_4_ = 0;
    }
    else {
      if (WVar2 != GET_POINTER_FIELD) {
        WVar2 = rpc::PromisedAnswer::Op::Reader::which((Reader *)&op);
        local_cc = (uint)WVar2;
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[25],unsigned_int>
                  (&local_c8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0x53,FAILED,(char *)0x0,"\"Unsupported pipeline op.\", (uint)opReader.which()",
                   (char (*) [25])"Unsupported pipeline op.",&local_cc);
        kj::Maybe<kj::Array<capnp::PipelineOp>_>::Maybe(in_RDI,(void *)0x0);
        local_d0 = 1;
        kj::_::Debug::Fault::~Fault(&local_c8);
        goto LAB_00797470;
      }
      f.exception._0_4_ = 1;
      f.exception._4_2_ = rpc::PromisedAnswer::Op::Reader::getGetPointerField((Reader *)&op);
    }
    kj::ArrayBuilder<capnp::PipelineOp>::add<capnp::PipelineOp&>
              ((ArrayBuilder<capnp::PipelineOp> *)&__range2,(PipelineOp *)&f);
    IndexingIterator<const_capnp::List<capnp::rpc::PromisedAnswer::Op,_(capnp::Kind)3>::Reader,_capnp::rpc::PromisedAnswer::Op::Reader>
    ::operator++((IndexingIterator<const_capnp::List<capnp::rpc::PromisedAnswer::Op,_(capnp::Kind)3>::Reader,_capnp::rpc::PromisedAnswer::Op::Reader>
                  *)local_48);
  } while( true );
}

Assistant:

kj::Maybe<kj::Array<PipelineOp>> toPipelineOps(List<rpc::PromisedAnswer::Op>::Reader ops) {
  auto result = kj::heapArrayBuilder<PipelineOp>(ops.size());
  for (auto opReader: ops) {
    PipelineOp op;
    switch (opReader.which()) {
      case rpc::PromisedAnswer::Op::NOOP:
        op.type = PipelineOp::NOOP;
        break;
      case rpc::PromisedAnswer::Op::GET_POINTER_FIELD:
        op.type = PipelineOp::GET_POINTER_FIELD;
        op.pointerIndex = opReader.getGetPointerField();
        break;
      default:
        KJ_FAIL_REQUIRE("Unsupported pipeline op.", (uint)opReader.which()) {
          return nullptr;
        }
    }
    result.add(op);
  }
  return result.finish();
}